

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::setTarget(XFormWidget *this,Selection *_target)

{
  undefined8 uVar1;
  void *in_RSI;
  long in_RDI;
  SceneObject *originalObj;
  XFormWidget *in_stack_00000280;
  
  uVar1 = *(undefined8 *)(in_RDI + 0xf0);
  memcpy((void *)(in_RDI + 0xf0),in_RSI,0x2c);
  if ((*(byte *)(in_RDI + 0x1d1) & 1) != 0) {
    if (*(long *)(in_RDI + 0xf0) == in_RDI) {
      *(undefined8 *)(in_RDI + 0xf0) = uVar1;
    }
    *(undefined8 *)(in_RDI + 0xf8) = 0;
  }
  updateGeometry(in_stack_00000280);
  return;
}

Assistant:

void XFormWidget::setTarget(Selection& _target) {
  auto originalObj = target.object;
  target = _target;
  if (objectMode) {
    if (target.object == this) target.object = originalObj;
    target.element = nullptr;
  }

  updateGeometry();
}